

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSModuleDef * js_new_module_def(JSContext *ctx,JSAtom name)

{
  JSAtom in_ESI;
  JSModuleDef *m;
  undefined4 in_stack_ffffffffffffff98;
  JSAtom in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  JSContext *in_stack_ffffffffffffffb8;
  uint uStack_3c;
  uint uStack_2c;
  JSModuleDef *local_8;
  
  local_8 = (JSModuleDef *)
            js_mallocz(in_stack_ffffffffffffffb8,
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (local_8 == (JSModuleDef *)0x0) {
    JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                in_stack_ffffffffffffff9c);
    local_8 = (JSModuleDef *)0x0;
  }
  else {
    (local_8->header).ref_count = 1;
    local_8->module_name = in_ESI;
    (local_8->module_ns).u.ptr = (void *)((ulong)uStack_2c << 0x20);
    (local_8->module_ns).tag = 3;
    (local_8->func_obj).u.ptr = (void *)((ulong)uStack_3c << 0x20);
    (local_8->func_obj).tag = 3;
    (local_8->eval_exception).u.ptr = (void *)((ulong)in_stack_ffffffffffffffb4 << 0x20);
    (local_8->eval_exception).tag = 3;
    (local_8->meta_obj).u.ptr = (void *)((ulong)in_stack_ffffffffffffffa4 << 0x20);
    (local_8->meta_obj).tag = 3;
    list_add_tail((list_head *)((ulong)in_stack_ffffffffffffffa4 << 0x20),
                  (list_head *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  return local_8;
}

Assistant:

static JSModuleDef *js_new_module_def(JSContext *ctx, JSAtom name)
{
    JSModuleDef *m;
    m = js_mallocz(ctx, sizeof(*m));
    if (!m) {
        JS_FreeAtom(ctx, name);
        return NULL;
    }
    m->header.ref_count = 1;
    m->module_name = name;
    m->module_ns = JS_UNDEFINED;
    m->func_obj = JS_UNDEFINED;
    m->eval_exception = JS_UNDEFINED;
    m->meta_obj = JS_UNDEFINED;
    list_add_tail(&m->link, &ctx->loaded_modules);
    return m;
}